

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O1

ssize_t __thiscall wasm::ModuleWriter::write(ModuleWriter *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  ModuleWriter *this_00;
  _Alloc_hider _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  if ((this->binary == true) && (*(long *)((long)__buf + 8) != 0)) {
    paVar3 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,*__buf,*(long *)((long)__buf + 8) + *__buf);
    writeBinary(this,(Module *)CONCAT44(in_register_00000034,__fd),&local_68);
    sVar1 = extraout_RAX;
    _Var2._M_p = local_68._M_dataplus._M_p;
  }
  else {
    paVar3 = &local_38;
    this_00 = (ModuleWriter *)local_48;
    local_48[0] = paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*__buf,*(long *)((long)__buf + 8) + *__buf);
    writeText(this_00,(Module *)CONCAT44(in_register_00000034,__fd),(string *)local_48);
    sVar1 = extraout_RAX_00;
    _Var2._M_p = (pointer)local_48[0];
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p != paVar3) {
    operator_delete(_Var2._M_p,paVar3->_M_allocated_capacity + 1);
    sVar1 = extraout_RAX_01;
  }
  return sVar1;
}

Assistant:

void ModuleWriter::write(Module& wasm, std::string filename) {
  if (binary && filename.size() > 0) {
    writeBinary(wasm, filename);
  } else {
    writeText(wasm, filename);
  }
}